

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Impulse_::treble_eq(Blip_Impulse_ *this,blip_eq_t *new_eq)

{
  Blip_Impulse_ *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *in_RSI;
  double *in_RDI;
  double dVar5;
  Blip_Impulse_ *this_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double unit;
  int index;
  int i_1;
  double sum;
  int w;
  int n;
  int offset;
  int step;
  imp_t *imp;
  double factor;
  double window;
  double y;
  double c;
  double d;
  double a;
  double b;
  double cos_nc1_angle;
  double cos_nc_angle;
  double cos_angle;
  double angle;
  int i;
  int size;
  float buf [352];
  double to_angle;
  double total;
  double pow_a_nc;
  double pow_a_n;
  double rescale;
  double rolloff;
  double n_harm;
  double cutoff;
  double pt;
  double sample_rate;
  double treble_freq;
  double treble;
  double in_stack_fffffffffffff958;
  int local_680;
  int local_67c;
  double local_678;
  int local_670;
  int local_66c;
  int local_668;
  undefined2 *local_660;
  double local_648;
  int local_600;
  float afStack_5f8 [354];
  undefined8 local_70;
  double local_68;
  double local_60;
  double local_58;
  Blip_Impulse_ *local_50;
  double local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  
  if (((((*(byte *)((long)in_RDI + 0x3c) & 1) != 0) || (*in_RSI != *in_RDI)) ||
      (NAN(*in_RSI) || NAN(*in_RDI))) || ((in_RSI[1] != in_RDI[1] || (in_RSI[2] != in_RDI[2])))) {
    *(undefined1 *)((long)in_RDI + 0x3c) = 0;
    *in_RDI = *in_RSI;
    in_RDI[1] = in_RSI[1];
    in_RDI[2] = in_RSI[2];
    local_18 = pow(10.0,*in_RDI * 0.05);
    if (local_18 < 5e-06) {
      local_18 = 5e-06;
    }
    local_20 = 0x40d5888000000000;
    local_28 = (double)(long)in_RDI[2];
    local_30 = 44100.0 / local_28;
    local_38 = (double)((long)in_RDI[1] << 1) / local_28;
    if ((local_30 * 0.95 <= local_38) || (0.95 <= local_38)) {
      local_38 = 0.5;
      local_18 = 1.0;
    }
    local_40 = 0x40b0000000000000;
    local_48 = pow(local_18,1.0 / (local_30 * 4096.0 + -(local_38 * 4096.0)));
    dVar5 = pow(local_48,local_38 * 4096.0);
    this_00 = (Blip_Impulse_ *)(1.0 / dVar5);
    local_50 = this_00;
    local_58 = pow(local_48,4096.0);
    pBVar1 = local_50;
    local_58 = (double)this_00 * local_58;
    dVar5 = pow(local_48,local_38 * 4096.0);
    local_60 = (double)pBVar1 * dVar5;
    local_68 = 0.0;
    local_70 = 0x3ee921fb54442d18;
    iVar2 = ((*(int *)(in_RDI + 6) + -2) * 0x20) / 2;
    local_600 = iVar2;
    while (iVar3 = local_600 + -1, local_600 != 0) {
      dVar6 = (double)(iVar3 * 2 + 1) * 1.1984224905356572e-05;
      dVar7 = cos(dVar6);
      dVar8 = cos(local_38 * 4096.0 * dVar6);
      dVar9 = cos((local_38 * 4096.0 + -1.0) * dVar6);
      dVar10 = 2.0 - (dVar7 + dVar7);
      dVar11 = local_48 * (local_48 - (dVar7 + dVar7)) + 1.0;
      in_stack_fffffffffffff958 = local_58 * local_48;
      dVar12 = cos(dVar6 * 4095.0);
      dVar5 = local_58;
      dVar13 = cos(dVar6 * 4096.0);
      local_648 = ((((1.0 - dVar7) - dVar8) + dVar9) * dVar11 +
                  (local_60 * dVar8 +
                  -(local_60 * local_48) * dVar9 +
                  in_stack_fffffffffffff958 * dVar12 + -(dVar5 * dVar13)) * dVar10) /
                  (dVar10 * dVar11);
      if (0xc < *(int *)(in_RDI + 6)) {
        dVar5 = cos(dVar6 * 136.53333333333333);
        local_648 = dVar5 * dVar5 * local_648;
      }
      local_68 = (double)(float)local_648 + local_68;
      afStack_5f8[iVar3] = (float)local_648;
      local_600 = iVar3;
    }
    dVar5 = 16384.0 / local_68;
    local_660 = (undefined2 *)in_RDI[5];
    iVar3 = *(int *)(in_RDI + 7);
    local_668 = 0x10;
    if (1 < *(int *)(in_RDI + 7)) {
      local_668 = 0x20;
    }
    local_66c = *(int *)(in_RDI + 7) / 2 + 1;
    while (local_66c != 0) {
      for (local_670 = -*(int *)(in_RDI + 6) / 2; local_670 < *(int *)(in_RDI + 6) / 2;
          local_670 = local_670 + 1) {
        local_678 = 0.0;
        local_67c = 0x20;
        while (iVar4 = local_67c + -1, local_67c != 0) {
          local_680 = local_670 * 0x20 + local_668 + iVar4;
          if (local_680 < 0) {
            local_680 = -1 - local_680;
          }
          local_67c = iVar4;
          if (local_680 < iVar2) {
            local_678 = (double)afStack_5f8[local_680] + local_678;
          }
        }
        dVar6 = floor(local_678 * dVar5 + 16384.5);
        *local_660 = (short)(int)dVar6;
        local_660 = local_660 + 1;
      }
      local_668 = local_668 - (int)(0x20 / (long)iVar3);
      local_66c = local_66c + -1;
    }
    if (0.0 <= in_RDI[3]) {
      in_RDI[3] = -1.0;
      volume_unit(this_00,in_stack_fffffffffffff958);
    }
  }
  return;
}

Assistant:

void Blip_Impulse_::treble_eq( const blip_eq_t& new_eq )
{
	if ( !generate && new_eq.treble == eq.treble && new_eq.cutoff == eq.cutoff &&
			new_eq.sample_rate == eq.sample_rate )
		return; // already calculated with same parameters
	
	generate = false;
	eq = new_eq;
	
	double treble = pow( 10.0, 1.0 / 20 * eq.treble ); // dB (-6dB = 0.50)
	if ( treble < 0.000005 )
		treble = 0.000005;
	
	const double treble_freq = 22050.0; // treble level at 22 kHz harmonic
	const double sample_rate = eq.sample_rate;
	const double pt = treble_freq * 2 / sample_rate;
	double cutoff = eq.cutoff * 2 / sample_rate;
	if ( cutoff >= pt * 0.95 || cutoff >= 0.95 ) {
		cutoff = 0.5;
		treble = 1.0;
	}
	
	// DSF Synthesis (See T. Stilson & J. Smith (1996),
	// Alias-free digital synthesis of classic analog waveforms)
	
	// reduce adjacent impulse interference by using small part of wide impulse
	const double n_harm = 4096;
	const double rolloff = pow( treble, 1.0 / (n_harm * pt - n_harm * cutoff) );
	const double rescale = 1.0 / pow( rolloff, n_harm * cutoff );
	
	const double pow_a_n = rescale * pow( rolloff, n_harm );
	const double pow_a_nc = rescale * pow( rolloff, n_harm * cutoff );
	
	double total = 0.0;
	const double to_angle = pi / 2 / n_harm / max_res;
	
	float buf [max_res * (Blip_Buffer::widest_impulse_ - 2) / 2];
	const int size = max_res * (width - 2) / 2;
	for ( int i = size; i--; )
	{
		double angle = (i * 2 + 1) * to_angle;
		
		// equivalent
		//double y =     dsf( angle, n_harm * cutoff, 1.0 );
		//y -= rescale * dsf( angle, n_harm * cutoff, rolloff );
		//y += rescale * dsf( angle, n_harm,          rolloff );
		
		const double cos_angle = cos( angle );
		const double cos_nc_angle = cos( n_harm * cutoff * angle );
		const double cos_nc1_angle = cos( (n_harm * cutoff - 1.0) * angle );
		
		double b = 2.0 - 2.0 * cos_angle;
		double a = 1.0 - cos_angle - cos_nc_angle + cos_nc1_angle;
		
		double d = 1.0 + rolloff * (rolloff - 2.0 * cos_angle);
		double c = pow_a_n * rolloff * cos( (n_harm - 1.0) * angle ) -
				pow_a_n * cos( n_harm * angle ) -
				pow_a_nc * rolloff * cos_nc1_angle +
				pow_a_nc * cos_nc_angle;
		
		// optimization of a / b + c / d
		double y = (a * d + c * b) / (b * d);
		
		// fixed window which affects wider impulses more
		if ( width > 12 ) {
			double window = cos( n_harm / 1.25 / Blip_Buffer::widest_impulse_ * angle );
			y *= window * window;
		}
		
		total += (float) y;
		buf [i] = (float) y;
	}
	
	// integrate runs of length 'max_res'
	double factor = impulse_amp * 0.5 / total; // 0.5 accounts for other mirrored half
	imp_t* imp = impulse;
	const int step = max_res / res;
	int offset = res > 1 ? max_res : max_res / 2;
	for ( int n = res / 2 + 1; n--; offset -= step )
	{
		for ( int w = -width / 2; w < width / 2; w++ )
		{
			double sum = 0;
			for ( int i = max_res; i--; )
			{
				int index = w * max_res + offset + i;
				if ( index < 0 )
					index = -index - 1;
				if ( index < size )
					sum += buf [index];
			}
			*imp++ = (imp_t) floor( sum * factor + (impulse_offset + 0.5) );
		}
	}
	
	// rescale
	double unit = volume_unit_;
	if ( unit >= 0 ) {
		volume_unit_ = -1;
		volume_unit( unit );
	}
}